

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::RestoreOneScope(ByteCodeGenerator *this,ScopeInfo *scopeInfo,FuncInfo *func)

{
  ScopeType SVar1;
  Scope *innerScope;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  char16_t *pcVar5;
  
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ByteCodePhase);
  if (bVar3) {
    pcVar5 = L"isObject";
    if ((*(ushort *)&scopeInfo->field_0x10 & 2) == 0) {
      pcVar5 = L"";
    }
    Output::Print(L"\nRestore ScopeInfo: %s #symbols: %d %s\n",func->name,
                  (ulong)(uint)scopeInfo->symbolCount,pcVar5);
  }
  innerScope = scopeInfo->scope;
  innerScope->func = func;
  SVar1 = innerScope->scopeType;
  if (SVar1 - ScopeType_GlobalEvalBlock < 2) {
    if ((func->bodyScope != (Scope *)0x0) &&
       ((SVar1 != ScopeType_GlobalEvalBlock || (func->bodyScope->scopeType != ScopeType_Global)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x448,
                         "(func->GetBodyScope() == nullptr || (func->GetBodyScope()->GetScopeType() == ScopeType_Global && scope->GetScopeType() == ScopeType_GlobalEvalBlock))"
                         ,
                         "func->GetBodyScope() == nullptr || (func->GetBodyScope()->GetScopeType() == ScopeType_Global && scope->GetScopeType() == ScopeType_GlobalEvalBlock)"
                        );
      if (!bVar3) goto LAB_0077a591;
      *puVar4 = 0;
    }
    func->bodyScope = innerScope;
    *(uint *)&func->field_0xb4 =
         *(uint *)&func->field_0xb4 & 0xfffffeff | (*(uint *)&scopeInfo->field_0x10 & 8) << 5;
  }
  else if (SVar1 == ScopeType_FuncExpr) {
    if (func->funcExprScope != (Scope *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x442,"(func->GetFuncExprScope() == nullptr)",
                         "func->GetFuncExprScope() == nullptr");
      if (!bVar3) goto LAB_0077a591;
      *puVar4 = 0;
    }
    func->funcExprScope = innerScope;
  }
  else if (SVar1 == ScopeType_Parameter) {
    if (func->paramScope != (Scope *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x43d,"(func->GetParamScope() == nullptr)",
                         "func->GetParamScope() == nullptr");
      if (!bVar3) goto LAB_0077a591;
      *puVar4 = 0;
    }
    func->paramScope = innerScope;
  }
  if (((scopeInfo->field_0x10 & 8) != 0) && (innerScope != func->bodyScope)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x44e,"(!scopeInfo->IsCached() || scope == func->GetBodyScope())",
                       "!scopeInfo->IsCached() || scope == func->GetBodyScope()");
    if (!bVar3) {
LAB_0077a591:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  scopeInfo->scope = (Type)0x0;
  PushScope(this,innerScope);
  return;
}

Assistant:

void ByteCodeGenerator::RestoreOneScope(Js::ScopeInfo * scopeInfo, FuncInfo * func)
{
    TRACE_BYTECODE(_u("\nRestore ScopeInfo: %s #symbols: %d %s\n"),
        func->name, scopeInfo->GetSymbolCount(), scopeInfo->IsObject() ? _u("isObject") : _u(""));

    Scope * scope = scopeInfo->GetScope();

    scope->SetFunc(func);

    switch (scope->GetScopeType())
    {
        case ScopeType_Parameter:
            Assert(func->GetParamScope() == nullptr);
            func->SetParamScope(scope);
            break;

        case ScopeType_FuncExpr:
            Assert(func->GetFuncExprScope() == nullptr);
            func->SetFuncExprScope(scope);
            break;

        case ScopeType_FunctionBody:
        case ScopeType_GlobalEvalBlock:
            Assert(func->GetBodyScope() == nullptr || (func->GetBodyScope()->GetScopeType() == ScopeType_Global && scope->GetScopeType() == ScopeType_GlobalEvalBlock));
            func->SetBodyScope(scope);
            func->SetHasCachedScope(scopeInfo->IsCached());
            break;
    }
    
    Assert(!scopeInfo->IsCached() || scope == func->GetBodyScope());

    // scopeInfo->scope was created/saved during parsing.
    // We no longer need it by now.
    // Clear it to avoid GC false positive (arena memory later used by GC).
    scopeInfo->SetScope(nullptr);
    this->PushScope(scope);
}